

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

IntervalMap<unsigned_long,_std::monostate,_3U> * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::intersection
          (IntervalMap<unsigned_long,_std::monostate,_3U> *__return_storage_ptr__,
          IntervalMap<unsigned_long,_std::monostate,_3U> *this,
          IntervalMap<unsigned_long,_std::monostate,_3U> *other,allocator_type *alloc)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong left;
  const_iterator *pcVar5;
  long lVar6;
  long lVar7;
  const_iterator lit;
  const_iterator rit;
  const_iterator rend;
  const_iterator lend;
  const_iterator local_130;
  const_iterator local_f0;
  const_iterator local_b0;
  const_iterator local_70;
  
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->rootSize = 0;
  begin(&local_130,this);
  begin(&local_f0,other);
  end(&local_70,this);
  end(&local_b0,other);
  while( true ) {
    bVar3 = IntervalMapDetails::Path::operator==(&local_130.path,&local_70.path);
    if (bVar3) break;
    bVar3 = IntervalMapDetails::Path::operator==(&local_f0.path,&local_b0.path);
    if (bVar3) break;
    lVar6 = (ulong)local_130.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                   .data_[local_130.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                   offset * 0x10;
    uVar1 = *(ulong *)((long)local_130.path.path.
                             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                             [local_130.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1]
                             .node + lVar6 + 8);
    lVar7 = (ulong)local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                   data_[local_f0.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                   offset * 0x10;
    left = *(ulong *)((long)local_f0.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                            [local_f0.path.path.
                             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                            node + lVar7);
    pcVar5 = &local_130;
    if (uVar1 < left) {
LAB_00384318:
      const_iterator::operator++(pcVar5);
    }
    else {
      uVar4 = *(ulong *)((long)local_130.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                               [local_130.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len -
                                1].node + lVar6);
      uVar2 = *(ulong *)((long)local_f0.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                               [local_f0.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len -
                                1].node + lVar7 + 8);
      pcVar5 = &local_f0;
      if (uVar2 < uVar4) goto LAB_00384318;
      if (left < uVar4) {
        left = uVar4;
      }
      uVar4 = uVar1;
      if (uVar2 < uVar1) {
        uVar4 = uVar2;
      }
      unionWith(__return_storage_ptr__,left,uVar4,
                (monostate *)
                ((long)local_130.path.path.
                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                       [local_130.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].node
                + (ulong)local_130.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                         [local_130.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                         offset + (ulong)((local_130.map)->height != 0) * 0x80 + 0x30),alloc);
      pcVar5 = &local_f0;
      if (uVar1 < uVar2) {
        pcVar5 = &local_130;
      }
      const_iterator::operator++(pcVar5);
    }
  }
  if (local_b0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_b0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
               firstElement) {
    operator_delete(local_b0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                    .data_);
  }
  if (local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
               firstElement) {
    operator_delete(local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                    .data_);
  }
  if (local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
               firstElement) {
    operator_delete(local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                    .data_);
  }
  if (local_130.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_130.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
               firstElement) {
    operator_delete(local_130.path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

IntervalMap<TKey, TValue, N> IntervalMap<TKey, TValue, N>::intersection(
    const IntervalMap& other, allocator_type& alloc) const {

    IntervalMap result;
    auto lit = begin(), rit = other.begin();
    auto lend = end(), rend = other.end();
    while (lit != lend && rit != rend) {
        auto lkey = lit.bounds(), rkey = rit.bounds();
        if (lkey.second < rkey.first) {
            ++lit;
        }
        else if (rkey.second < lkey.first) {
            ++rit;
        }
        else {
            // We will arbitrarily take the left hand value,
            // since there's no way to merge them. Presumably if
            // this method is being called the values don't matter.
            auto left = std::max(lkey.first, rkey.first);
            auto right = std::min(lkey.second, rkey.second);
            result.unionWith(left, right, *lit, alloc);

            if (lkey.second < rkey.second)
                ++lit;
            else
                ++rit;
        }
    }
    return result;
}